

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_ts.cpp
# Opt level: O3

void __thiscall
flatbuffers::ts::TsGenerator::GenStructBody
          (TsGenerator *this,StructDef *struct_def,string *body,string *nameprefix)

{
  BaseType BVar1;
  FieldDef *pFVar2;
  StructDef *pSVar3;
  size_type sVar4;
  pointer pcVar5;
  long lVar6;
  long *plVar7;
  undefined8 *puVar8;
  size_type *psVar9;
  long *plVar10;
  pointer ppFVar11;
  undefined8 uVar12;
  _Alloc_hider _Var13;
  string *psVar14;
  string class_name;
  string fname;
  string str_last_item_idx;
  string pack_func_create_call;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string local_198;
  string local_178;
  string local_158;
  _Alloc_hider local_138;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_128;
  string *local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  TsGenerator *local_f0;
  long *local_e8;
  long local_e0;
  long local_d8;
  long lStack_d0;
  string *local_c8;
  StructDef *local_c0;
  long *local_b8 [2];
  long local_a8 [2];
  string local_98;
  string local_78;
  IdlNamer *local_58;
  string local_50;
  
  local_f0 = this;
  local_c8 = nameprefix;
  std::__cxx11::string::append((char *)body);
  local_c0 = struct_def;
  NumToString<unsigned_long>(&local_178,struct_def->minalign);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_178);
  psVar9 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_158.field_2._M_allocated_capacity = *psVar9;
    local_158.field_2._8_8_ = plVar7[3];
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  }
  else {
    local_158.field_2._M_allocated_capacity = *psVar9;
    local_158._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_158._M_string_length = plVar7[1];
  *plVar7 = (long)psVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  std::__cxx11::string::_M_append((char *)body,(ulong)local_158._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
  }
  NumToString<unsigned_long>(&local_178,local_c0->bytesize);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_178);
  psVar9 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_158.field_2._M_allocated_capacity = *psVar9;
    local_158.field_2._8_8_ = plVar7[3];
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  }
  else {
    local_158.field_2._M_allocated_capacity = *psVar9;
    local_158._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_158._M_string_length = plVar7[1];
  *plVar7 = (long)psVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  std::__cxx11::string::_M_append((char *)body,(ulong)local_158._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_118 = body;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
  }
  ppFVar11 = (local_c0->fields).vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  if (ppFVar11 !=
      (local_c0->fields).vec.
      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_58 = &local_f0->namer_;
    do {
      pFVar2 = ppFVar11[-1];
      if (pFVar2->padding != 0) {
        NumToString<unsigned_long>(&local_198,pFVar2->padding);
        plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_198,0,(char *)0x0,0x36d966);
        psVar14 = local_118;
        local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
        psVar9 = (size_type *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar9) {
          local_178.field_2._M_allocated_capacity = *psVar9;
          local_178.field_2._8_8_ = plVar7[3];
        }
        else {
          local_178.field_2._M_allocated_capacity = *psVar9;
          local_178._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_178._M_string_length = plVar7[1];
        *plVar7 = (long)psVar9;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_178);
        local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
        psVar9 = (size_type *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar9) {
          local_158.field_2._M_allocated_capacity = *psVar9;
          local_158.field_2._8_8_ = plVar7[3];
        }
        else {
          local_158.field_2._M_allocated_capacity = *psVar9;
          local_158._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_158._M_string_length = plVar7[1];
        *plVar7 = (long)psVar9;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        std::__cxx11::string::_M_append((char *)psVar14,(ulong)local_158._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != &local_158.field_2) {
          operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178._M_dataplus._M_p != &local_178.field_2) {
          operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p != &local_198.field_2) {
          operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
        }
      }
      BVar1 = (pFVar2->value).type.base_type;
      if (BVar1 == BASE_TYPE_STRUCT) {
        pSVar3 = (pFVar2->value).type.struct_def;
        if (pSVar3->fixed != true) {
LAB_0025cf8d:
          if (local_c8->_M_string_length == 0) {
            pcVar5 = (pFVar2->super_Definition).name._M_dataplus._M_p;
            local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_158,pcVar5,
                       pcVar5 + (pFVar2->super_Definition).name._M_string_length);
            psVar14 = local_118;
          }
          else {
            local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
            pcVar5 = (local_c8->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_178,pcVar5,pcVar5 + local_c8->_M_string_length);
            std::__cxx11::string::append((char *)&local_178);
            psVar14 = local_118;
            puVar8 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_178,
                                (ulong)(pFVar2->super_Definition).name._M_dataplus._M_p);
            local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
            psVar9 = puVar8 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar8 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar9) {
              local_158.field_2._M_allocated_capacity = *psVar9;
              local_158.field_2._8_8_ = puVar8[3];
            }
            else {
              local_158.field_2._M_allocated_capacity = *psVar9;
              local_158._M_dataplus._M_p = (pointer)*puVar8;
            }
            local_158._M_string_length = puVar8[1];
            *puVar8 = psVar9;
            puVar8[1] = 0;
            *(undefined1 *)(puVar8 + 2) = 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_178._M_dataplus._M_p != &local_178.field_2) {
              operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1
                             );
            }
          }
          GenWriteMethod_abi_cxx11_((string *)&local_138,local_f0,&(pFVar2->value).type);
          puVar8 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_138,0,(char *)0x0,0x36f028);
          local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
          psVar9 = puVar8 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar9) {
            local_198.field_2._M_allocated_capacity = *psVar9;
            local_198.field_2._8_8_ = puVar8[3];
          }
          else {
            local_198.field_2._M_allocated_capacity = *psVar9;
            local_198._M_dataplus._M_p = (pointer)*puVar8;
          }
          local_198._M_string_length = puVar8[1];
          *puVar8 = psVar9;
          puVar8[1] = 0;
          *(undefined1 *)(puVar8 + 2) = 0;
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_198);
          local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
          psVar9 = (size_type *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar9) {
            local_178.field_2._M_allocated_capacity = *psVar9;
            local_178.field_2._8_8_ = plVar7[3];
          }
          else {
            local_178.field_2._M_allocated_capacity = *psVar9;
            local_178._M_dataplus._M_p = (pointer)*plVar7;
          }
          local_178._M_string_length = plVar7[1];
          *plVar7 = (long)psVar9;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          std::__cxx11::string::_M_append((char *)psVar14,(ulong)local_178._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_178._M_dataplus._M_p != &local_178.field_2) {
            operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._M_dataplus._M_p != &local_198.field_2) {
            operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_p != &aStack_128) {
            operator_delete(local_138._M_p,
                            CONCAT44(aStack_128._M_allocated_capacity._4_4_,
                                     CONCAT22(aStack_128._M_allocated_capacity._2_2_,
                                              aStack_128._M_allocated_capacity._0_2_)) + 1);
          }
          BVar1 = (pFVar2->value).type.base_type;
          if (BVar1 - BASE_TYPE_LONG < 2) {
            std::operator+(&local_198,"BigInt(",&local_158);
            puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_198);
            local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
            psVar9 = puVar8 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar8 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar9) {
              local_178.field_2._M_allocated_capacity = *psVar9;
              local_178.field_2._8_8_ = puVar8[3];
            }
            else {
              local_178.field_2._M_allocated_capacity = *psVar9;
              local_178._M_dataplus._M_p = (pointer)*puVar8;
            }
            local_178._M_string_length = puVar8[1];
            *puVar8 = psVar9;
            puVar8[1] = 0;
            *(undefined1 *)(puVar8 + 2) = 0;
            std::__cxx11::string::_M_append((char *)psVar14,(ulong)local_178._M_dataplus._M_p);
          }
          else {
            if (BVar1 != BASE_TYPE_BOOL) {
              local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_178,local_158._M_dataplus._M_p,
                         local_158._M_dataplus._M_p + local_158._M_string_length);
              std::__cxx11::string::append((char *)&local_178);
              std::__cxx11::string::_M_append((char *)psVar14,(ulong)local_178._M_dataplus._M_p);
              goto LAB_0025dff3;
            }
            std::operator+(&local_198,"Number(Boolean(",&local_158);
            puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_198);
            local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
            psVar9 = puVar8 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar8 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar9) {
              local_178.field_2._M_allocated_capacity = *psVar9;
              local_178.field_2._8_8_ = puVar8[3];
            }
            else {
              local_178.field_2._M_allocated_capacity = *psVar9;
              local_178._M_dataplus._M_p = (pointer)*puVar8;
            }
            local_178._M_string_length = puVar8[1];
            *puVar8 = psVar9;
            puVar8[1] = 0;
            *(undefined1 *)(puVar8 + 2) = 0;
            std::__cxx11::string::_M_append((char *)psVar14,(ulong)local_178._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_178._M_dataplus._M_p != &local_178.field_2) {
            operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
          }
          uVar12 = local_198.field_2._M_allocated_capacity;
          _Var13._M_p = local_198._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._M_dataplus._M_p != &local_198.field_2) goto LAB_0025e007;
          goto LAB_0025e00f;
        }
        sVar4 = local_c8->_M_string_length;
        if (sVar4 == 0) {
          local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
          pcVar5 = (pFVar2->super_Definition).name._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_158,pcVar5,
                     pcVar5 + (pFVar2->super_Definition).name._M_string_length);
        }
        else {
          local_b8[0] = local_a8;
          pcVar5 = (local_c8->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>((string *)local_b8,pcVar5,pcVar5 + sVar4);
          std::__cxx11::string::append((char *)local_b8);
          plVar7 = (long *)std::__cxx11::string::_M_append
                                     ((char *)local_b8,
                                      (ulong)(pFVar2->super_Definition).name._M_dataplus._M_p);
          local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
          psVar9 = (size_type *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar9) {
            local_158.field_2._M_allocated_capacity = *psVar9;
            local_158.field_2._8_8_ = plVar7[3];
          }
          else {
            local_158.field_2._M_allocated_capacity = *psVar9;
            local_158._M_dataplus._M_p = (pointer)*plVar7;
          }
          local_158._M_string_length = plVar7[1];
          *plVar7 = (long)psVar9;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
        }
        GenStructBody(local_f0,pSVar3,local_118,&local_158);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != &local_158.field_2) {
          operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
        }
        if ((sVar4 != 0) && (local_b8[0] != local_a8)) {
          operator_delete(local_b8[0],local_a8[0] + 1);
        }
      }
      else {
        if (BVar1 != BASE_TYPE_ARRAY) goto LAB_0025cf8d;
        BVar1 = (pFVar2->value).type.element;
        if (BVar1 == BASE_TYPE_STRUCT) {
          NumToString<int>(&local_158,(pFVar2->value).type.fixed_length - 1);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_138,"\n  for (let i = ",&local_158);
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_138);
          local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
          psVar9 = (size_type *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar9) {
            local_198.field_2._M_allocated_capacity = *psVar9;
            local_198.field_2._8_8_ = plVar7[3];
          }
          else {
            local_198.field_2._M_allocated_capacity = *psVar9;
            local_198._M_dataplus._M_p = (pointer)*plVar7;
          }
          local_198._M_string_length = plVar7[1];
          *plVar7 = (long)psVar9;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_198);
          local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
          psVar9 = (size_type *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar9) {
            local_178.field_2._M_allocated_capacity = *psVar9;
            local_178.field_2._8_8_ = plVar7[3];
          }
          else {
            local_178.field_2._M_allocated_capacity = *psVar9;
            local_178._M_dataplus._M_p = (pointer)*plVar7;
          }
          local_178._M_string_length = plVar7[1];
          *plVar7 = (long)psVar9;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          std::__cxx11::string::_M_append((char *)local_118,(ulong)local_178._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_178._M_dataplus._M_p != &local_178.field_2) {
            operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._M_dataplus._M_p != &local_198.field_2) {
            operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_p != &aStack_128) {
            operator_delete(local_138._M_p,
                            CONCAT44(aStack_128._M_allocated_capacity._4_4_,
                                     CONCAT22(aStack_128._M_allocated_capacity._2_2_,
                                              aStack_128._M_allocated_capacity._0_2_)) + 1);
          }
          if (local_c8->_M_string_length == 0) {
            local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
            pcVar5 = (pFVar2->super_Definition).name._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_178,pcVar5,
                       pcVar5 + (pFVar2->super_Definition).name._M_string_length);
          }
          else {
            local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
            pcVar5 = (local_c8->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_198,pcVar5,pcVar5 + local_c8->_M_string_length);
            std::__cxx11::string::append((char *)&local_198);
            puVar8 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_198,
                                (ulong)(pFVar2->super_Definition).name._M_dataplus._M_p);
            local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
            psVar9 = puVar8 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar8 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar9) {
              local_178.field_2._M_allocated_capacity = *psVar9;
              local_178.field_2._8_8_ = puVar8[3];
            }
            else {
              local_178.field_2._M_allocated_capacity = *psVar9;
              local_178._M_dataplus._M_p = (pointer)*puVar8;
            }
            local_178._M_string_length = puVar8[1];
            *puVar8 = psVar9;
            puVar8[1] = 0;
            *(undefined1 *)(puVar8 + 2) = 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_198._M_dataplus._M_p != &local_198.field_2) {
              operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1
                             );
            }
          }
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_138,"    const item = ",&local_178);
          puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_138);
          local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
          psVar9 = puVar8 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar9) {
            local_198.field_2._M_allocated_capacity = *psVar9;
            local_198.field_2._8_8_ = puVar8[3];
          }
          else {
            local_198.field_2._M_allocated_capacity = *psVar9;
            local_198._M_dataplus._M_p = (pointer)*puVar8;
          }
          local_198._M_string_length = puVar8[1];
          *puVar8 = psVar9;
          puVar8[1] = 0;
          *(undefined1 *)(puVar8 + 2) = 0;
          std::__cxx11::string::_M_append((char *)local_118,(ulong)local_198._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._M_dataplus._M_p != &local_198.field_2) {
            operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_p != &aStack_128) {
            operator_delete(local_138._M_p,
                            CONCAT44(aStack_128._M_allocated_capacity._4_4_,
                                     CONCAT22(aStack_128._M_allocated_capacity._2_2_,
                                              aStack_128._M_allocated_capacity._0_2_)) + 1);
          }
          if ((((local_f0->super_BaseGenerator).parser_)->opts).generate_object_based_api == true) {
            (*(local_58->super_Namer)._vptr_Namer[0x11])
                      (&local_110,local_58,(pFVar2->value).type.struct_def);
            plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_110,0,(char *)0x0,0x36efa4)
            ;
            local_138._M_p = (pointer)&aStack_128;
            plVar10 = plVar7 + 2;
            if ((long *)*plVar7 == plVar10) {
              lVar6 = *plVar10;
              aStack_128._M_allocated_capacity._0_2_ = (undefined2)lVar6;
              aStack_128._M_allocated_capacity._2_2_ = (undefined2)((ulong)lVar6 >> 0x10);
              aStack_128._M_allocated_capacity._4_4_ = (undefined4)((ulong)lVar6 >> 0x20);
              aStack_128._8_2_ = (undefined2)plVar7[3];
              aStack_128._10_6_ = (undefined6)((ulong)plVar7[3] >> 0x10);
            }
            else {
              lVar6 = *plVar10;
              aStack_128._M_allocated_capacity._0_2_ = (undefined2)lVar6;
              aStack_128._M_allocated_capacity._2_2_ = (undefined2)((ulong)lVar6 >> 0x10);
              aStack_128._M_allocated_capacity._4_4_ = (undefined4)((ulong)lVar6 >> 0x20);
              local_138._M_p = (pointer)*plVar7;
            }
            uStack_130 = (undefined4)plVar7[1];
            uStack_12c = (undefined4)((ulong)plVar7[1] >> 0x20);
            *plVar7 = (long)plVar10;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_138);
            local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
            psVar9 = puVar8 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar8 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar9) {
              local_198.field_2._M_allocated_capacity = *psVar9;
              local_198.field_2._8_8_ = puVar8[3];
            }
            else {
              local_198.field_2._M_allocated_capacity = *psVar9;
              local_198._M_dataplus._M_p = (pointer)*puVar8;
            }
            local_198._M_string_length = puVar8[1];
            *puVar8 = psVar9;
            puVar8[1] = 0;
            *(undefined1 *)(puVar8 + 2) = 0;
            std::__cxx11::string::_M_append((char *)local_118,(ulong)local_198._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_198._M_dataplus._M_p != &local_198.field_2) {
              operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_138._M_p != &aStack_128) {
              operator_delete(local_138._M_p,
                              CONCAT44(aStack_128._M_allocated_capacity._4_4_,
                                       CONCAT22(aStack_128._M_allocated_capacity._2_2_,
                                                aStack_128._M_allocated_capacity._0_2_)) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_110._M_dataplus._M_p != &local_110.field_2) {
              operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::string::append((char *)local_118);
            std::__cxx11::string::append((char *)local_118);
            std::__cxx11::string::append((char *)local_118);
          }
          std::operator+(&local_198,"",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (pFVar2->value).type.struct_def);
          local_e8 = &local_d8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_e8,local_198._M_dataplus._M_p,
                     local_198._M_dataplus._M_p + local_198._M_string_length);
          std::__cxx11::string::append((char *)&local_e8);
          plVar7 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_e8,(ulong)local_198._M_dataplus._M_p);
          local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
          psVar9 = (size_type *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar9) {
            local_110.field_2._M_allocated_capacity = *psVar9;
            local_110.field_2._8_8_ = plVar7[3];
          }
          else {
            local_110.field_2._M_allocated_capacity = *psVar9;
            local_110._M_dataplus._M_p = (pointer)*plVar7;
          }
          local_110._M_string_length = plVar7[1];
          *plVar7 = (long)psVar9;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_110);
          local_138._M_p = (pointer)&aStack_128;
          plVar10 = plVar7 + 2;
          if ((long *)*plVar7 == plVar10) {
            lVar6 = *plVar10;
            aStack_128._M_allocated_capacity._0_2_ = (undefined2)lVar6;
            aStack_128._M_allocated_capacity._2_2_ = (undefined2)((ulong)lVar6 >> 0x10);
            aStack_128._M_allocated_capacity._4_4_ = (undefined4)((ulong)lVar6 >> 0x20);
            aStack_128._8_2_ = (undefined2)plVar7[3];
            aStack_128._10_6_ = (undefined6)((ulong)plVar7[3] >> 0x10);
          }
          else {
            lVar6 = *plVar10;
            aStack_128._M_allocated_capacity._0_2_ = (undefined2)lVar6;
            aStack_128._M_allocated_capacity._2_2_ = (undefined2)((ulong)lVar6 >> 0x10);
            aStack_128._M_allocated_capacity._4_4_ = (undefined4)((ulong)lVar6 >> 0x20);
            local_138._M_p = (pointer)*plVar7;
          }
          uStack_130 = (undefined4)plVar7[1];
          uStack_12c = (undefined4)((ulong)plVar7[1] >> 0x20);
          *plVar7 = (long)plVar10;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_dataplus._M_p != &local_110.field_2) {
            operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
          }
          if (local_e8 != &local_d8) {
            operator_delete(local_e8,local_d8 + 1);
          }
          pSVar3 = (pFVar2->value).type.struct_def;
          local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"item","");
          local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,",\n    ","");
          GenStructMemberValueTS(&local_50,local_f0,pSVar3,&local_98,&local_78,false);
          plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x366c87);
          local_e8 = &local_d8;
          plVar10 = plVar7 + 2;
          if ((long *)*plVar7 == plVar10) {
            local_d8 = *plVar10;
            lStack_d0 = plVar7[3];
          }
          else {
            local_d8 = *plVar10;
            local_e8 = (long *)*plVar7;
          }
          local_e0 = plVar7[1];
          *plVar7 = (long)plVar10;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_e8);
          local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
          psVar9 = (size_type *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar9) {
            local_110.field_2._M_allocated_capacity = *psVar9;
            local_110.field_2._8_8_ = plVar7[3];
          }
          else {
            local_110.field_2._M_allocated_capacity = *psVar9;
            local_110._M_dataplus._M_p = (pointer)*plVar7;
          }
          local_110._M_string_length = plVar7[1];
          *plVar7 = (long)psVar9;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          std::__cxx11::string::_M_append((char *)&local_138,(ulong)local_110._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_dataplus._M_p != &local_110.field_2) {
            operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
          }
          if (local_e8 != &local_d8) {
            operator_delete(local_e8,local_d8 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
          std::operator+(&local_110,"    ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_138);
          std::__cxx11::string::_M_append((char *)local_118,(ulong)local_110._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_dataplus._M_p != &local_110.field_2) {
            operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::string::append((char *)local_118);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_p != &aStack_128) {
            operator_delete(local_138._M_p,
                            CONCAT44(aStack_128._M_allocated_capacity._4_4_,
                                     CONCAT22(aStack_128._M_allocated_capacity._2_2_,
                                              aStack_128._M_allocated_capacity._0_2_)) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._M_dataplus._M_p != &local_198.field_2) {
            operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          NumToString<int>(&local_158,(pFVar2->value).type.fixed_length - 1);
          psVar14 = local_118;
          if (local_c8->_M_string_length == 0) {
            local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
            pcVar5 = (pFVar2->super_Definition).name._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_178,pcVar5,
                       pcVar5 + (pFVar2->super_Definition).name._M_string_length);
          }
          else {
            local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
            pcVar5 = (local_c8->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_198,pcVar5,pcVar5 + local_c8->_M_string_length);
            std::__cxx11::string::append((char *)&local_198);
            plVar7 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_198,
                                        (ulong)(pFVar2->super_Definition).name._M_dataplus._M_p);
            local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
            psVar9 = (size_type *)(plVar7 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar7 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar9) {
              local_178.field_2._M_allocated_capacity = *psVar9;
              local_178.field_2._8_8_ = plVar7[3];
            }
            else {
              local_178.field_2._M_allocated_capacity = *psVar9;
              local_178._M_dataplus._M_p = (pointer)*plVar7;
            }
            local_178._M_string_length = plVar7[1];
            *plVar7 = (long)psVar9;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_198._M_dataplus._M_p != &local_198.field_2) {
              operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1
                             );
            }
          }
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_138,"\n  for (let i = ",&local_158);
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_138);
          local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
          psVar9 = (size_type *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar9) {
            local_198.field_2._M_allocated_capacity = *psVar9;
            local_198.field_2._8_8_ = plVar7[3];
          }
          else {
            local_198.field_2._M_allocated_capacity = *psVar9;
            local_198._M_dataplus._M_p = (pointer)*plVar7;
          }
          local_198._M_string_length = plVar7[1];
          *plVar7 = (long)psVar9;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          std::__cxx11::string::_M_append((char *)psVar14,(ulong)local_198._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._M_dataplus._M_p != &local_198.field_2) {
            operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_p != &aStack_128) {
            operator_delete(local_138._M_p,
                            CONCAT44(aStack_128._M_allocated_capacity._4_4_,
                                     CONCAT22(aStack_128._M_allocated_capacity._2_2_,
                                              aStack_128._M_allocated_capacity._0_2_)) + 1);
          }
          std::__cxx11::string::append((char *)psVar14);
          local_138._M_p._0_4_ = (pFVar2->value).type.element;
          local_138._M_p._4_4_ = BASE_TYPE_NONE;
          uStack_130 = 0;
          uStack_12c = 0;
          aStack_128._M_allocated_capacity._0_2_ = 0;
          aStack_128._M_allocated_capacity._2_2_ = 0;
          aStack_128._M_allocated_capacity._4_4_ = 0;
          aStack_128._8_2_ = 0;
          GenWriteMethod_abi_cxx11_(&local_198,local_f0,(Type *)&local_138);
          std::__cxx11::string::_M_append((char *)psVar14,(ulong)local_198._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._M_dataplus._M_p != &local_198.field_2) {
            operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::string::append((char *)psVar14);
          std::__cxx11::string::append((char *)psVar14);
          if (BVar1 - BASE_TYPE_LONG < 2) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_138,"BigInt(",&local_178);
            puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_138);
            local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
            psVar9 = puVar8 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar8 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar9) {
              local_198.field_2._M_allocated_capacity = *psVar9;
              local_198.field_2._8_8_ = puVar8[3];
            }
            else {
              local_198.field_2._M_allocated_capacity = *psVar9;
              local_198._M_dataplus._M_p = (pointer)*puVar8;
            }
            local_198._M_string_length = puVar8[1];
            *puVar8 = psVar9;
            puVar8[1] = 0;
            *(undefined1 *)(puVar8 + 2) = 0;
            std::__cxx11::string::_M_append((char *)psVar14,(ulong)local_198._M_dataplus._M_p);
          }
          else {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_138,"(",&local_178);
            puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_138);
            local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
            psVar9 = puVar8 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar8 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar9) {
              local_198.field_2._M_allocated_capacity = *psVar9;
              local_198.field_2._8_8_ = puVar8[3];
            }
            else {
              local_198.field_2._M_allocated_capacity = *psVar9;
              local_198._M_dataplus._M_p = (pointer)*puVar8;
            }
            local_198._M_string_length = puVar8[1];
            *puVar8 = psVar9;
            puVar8[1] = 0;
            *(undefined1 *)(puVar8 + 2) = 0;
            std::__cxx11::string::_M_append((char *)psVar14,(ulong)local_198._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._M_dataplus._M_p != &local_198.field_2) {
            operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_138._M_p._4_4_,(BaseType)local_138._M_p) != &aStack_128) {
            operator_delete((void *)CONCAT44(local_138._M_p._4_4_,(BaseType)local_138._M_p),
                            CONCAT44(aStack_128._M_allocated_capacity._4_4_,
                                     CONCAT22(aStack_128._M_allocated_capacity._2_2_,
                                              aStack_128._M_allocated_capacity._0_2_)) + 1);
          }
          std::__cxx11::string::append((char *)psVar14);
        }
LAB_0025dff3:
        uVar12 = local_178.field_2._M_allocated_capacity;
        _Var13._M_p = local_178._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178._M_dataplus._M_p != &local_178.field_2) {
LAB_0025e007:
          operator_delete(_Var13._M_p,uVar12 + 1);
        }
LAB_0025e00f:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != &local_158.field_2) {
          operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
        }
      }
      ppFVar11 = ppFVar11 + -1;
    } while (ppFVar11 !=
             (local_c0->fields).vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void GenStructBody(const StructDef &struct_def, std::string *body,
                     const std::string &nameprefix) {
    *body += "  builder.prep(";
    *body += NumToString(struct_def.minalign) + ", ";
    *body += NumToString(struct_def.bytesize) + ");\n";

    for (auto it = struct_def.fields.vec.rbegin();
         it != struct_def.fields.vec.rend(); ++it) {
      auto &field = **it;
      if (field.padding) {
        *body += "  builder.pad(" + NumToString(field.padding) + ");\n";
      }
      if (IsStruct(field.value.type)) {
        // Generate arguments for a struct inside a struct. To ensure names
        // don't clash, and to make it obvious these arguments are constructing
        // a nested struct, prefix the name with the field name.
        GenStructBody(
            *field.value.type.struct_def, body,
            nameprefix.length() ? nameprefix + "_" + field.name : field.name);
      } else {
        auto element_type = field.value.type.element;

        if (field.value.type.base_type == BASE_TYPE_ARRAY) {
          switch (field.value.type.element) {
            case BASE_TYPE_STRUCT: {
              std::string str_last_item_idx =
                  NumToString(field.value.type.fixed_length - 1);
              *body += "\n  for (let i = " + str_last_item_idx +
                       "; i >= 0; --i" + ") {\n";

              std::string fname = nameprefix.length()
                                      ? nameprefix + "_" + field.name
                                      : field.name;

              *body += "    const item = " + fname + "?.[i];\n\n";

              if (parser_.opts.generate_object_based_api) {
                *body += "    if (item instanceof " +
                         GetTypeName(*field.value.type.struct_def,
                                     /*object_api =*/true) +
                         ") {\n";
                *body += "      item.pack(builder);\n";
                *body += "      continue;\n";
                *body += "    }\n\n";
              }

              std::string class_name =
                  GetPrefixedName(*field.value.type.struct_def);
              std::string pack_func_create_call =
                  class_name + ".create" + class_name + "(builder,\n";
              pack_func_create_call +=
                  "    " +
                  GenStructMemberValueTS(*field.value.type.struct_def, "item",
                                         ",\n    ", false) +
                  "\n  ";
              *body += "    " + pack_func_create_call;
              *body += "  );\n  }\n\n";

              break;
            }
            default: {
              std::string str_last_item_idx =
                  NumToString(field.value.type.fixed_length - 1);
              std::string fname = nameprefix.length()
                                      ? nameprefix + "_" + field.name
                                      : field.name;

              *body += "\n  for (let i = " + str_last_item_idx +
                       "; i >= 0; --i) {\n";
              *body += "    builder.write";
              *body += GenWriteMethod(
                  static_cast<flatbuffers::Type>(field.value.type.element));
              *body += "(";
              *body += element_type == BASE_TYPE_BOOL ? "+" : "";

              if (element_type == BASE_TYPE_LONG ||
                  element_type == BASE_TYPE_ULONG) {
                *body += "BigInt(" + fname + "?.[i] ?? 0));\n";
              } else {
                *body += "(" + fname + "?.[i] ?? 0));\n\n";
              }
              *body += "  }\n\n";
              break;
            }
          }
        } else {
          std::string fname =
              nameprefix.length() ? nameprefix + "_" + field.name : field.name;

          *body += "  builder.write" + GenWriteMethod(field.value.type) + "(";
          if (field.value.type.base_type == BASE_TYPE_BOOL) {
            *body += "Number(Boolean(" + fname + ")));\n";
            continue;
          } else if (field.value.type.base_type == BASE_TYPE_LONG ||
                     field.value.type.base_type == BASE_TYPE_ULONG) {
            *body += "BigInt(" + fname + " ?? 0));\n";
            continue;
          }

          *body += fname + ");\n";
        }
      }
    }
  }